

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O2

MPP_RET vepu580_h265_setup_hal_bufs(H265eV580HalContext *ctx)

{
  uint uVar1;
  int iVar2;
  VepuFmtCfg *cfg;
  MppEncCfgSet *pMVar3;
  MppEncRefCfg ref;
  uint uVar4;
  MPP_RET MVar5;
  MPP_RET extraout_EAX;
  MppEncCpbInfo *pMVar6;
  MppEncCfgSet *pMVar7;
  int iVar8;
  uint uVar9;
  uint max_cnt;
  size_t local_48;
  long local_40;
  long local_38;
  
  cfg = (VepuFmtCfg *)ctx->input_fmt;
  pMVar3 = ctx->cfg;
  ref = pMVar3->ref_cfg;
  uVar1 = ctx->max_buf_cnt;
  pMVar7 = pMVar3;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0x16c);
    pMVar7 = ctx->cfg;
  }
  iVar8 = (pMVar3->prep).width;
  iVar2 = (pMVar3->prep).height;
  uVar9 = (iVar2 + 0xfU & 0xffffff0) * (iVar8 + 0xfU & 0xfffffff0);
  vepu541_set_fmt(cfg,(pMVar7->prep).format);
  if (ref == (MppEncRefCfg)0x0) {
    max_cnt = 4;
  }
  else {
    pMVar6 = mpp_enc_ref_cfg_get_cpb_info(ref);
    max_cnt = 4;
    if (2 < pMVar6->dpb_size) {
      max_cnt = pMVar6->dpb_size + 1;
    }
  }
  if ((ctx->frame_size < uVar9) || ((int)uVar1 < (int)max_cnt)) {
    hal_bufs_deinit(ctx->dpb_bufs);
    hal_bufs_init(&ctx->dpb_bufs);
    iVar8 = ((iVar2 + 0x3f) / 0x40 + 1) * ((iVar8 + 0x3f) / 0x40);
    uVar4 = iVar8 * 0x40 + 0x1fffU & 0xffffe000;
    ctx->fbc_header_len = uVar4;
    local_48 = (size_t)(int)((iVar8 * 0x3000 >> 1) + uVar4);
    local_40 = (long)(iVar8 * 0x100);
    local_38 = (long)(int)(iVar8 * 0x60 + 0xffU & 0xffffff00);
    if ((int)max_cnt <= (int)uVar1) {
      max_cnt = uVar1;
    }
    if (((byte)hal_h265e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","frame size %d -> %d max count %d -> %d\n",(char *)0x0,
                 (ulong)ctx->frame_size,(ulong)uVar9,(ulong)uVar1,(ulong)max_cnt);
    }
    hal_bufs_setup(ctx->dpb_bufs,max_cnt,3,&local_48);
    ctx->frame_size = uVar9;
    ctx->max_buf_cnt = max_cnt;
  }
  MVar5 = 0x303010;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0x18d);
    MVar5 = extraout_EAX;
  }
  return MVar5;
}

Assistant:

static MPP_RET vepu580_h265_setup_hal_bufs(H265eV580HalContext *ctx)
{
    MPP_RET ret = MPP_OK;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    RK_U32 frame_size;
    RK_S32 mb_wd64, mb_h64;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 4;

    hal_h265e_enter();

    mb_wd64 = (prep->width + 63) / 64;
    mb_h64 = (prep->height + 63) / 64 + 1;

    frame_size = MPP_ALIGN(prep->width, 16) * MPP_ALIGN(prep->height, 16);
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (frame_size > ctx->frame_size || new_max_cnt > old_max_cnt) {
        size_t size[3] = {0};

        hal_bufs_deinit(ctx->dpb_bufs);
        hal_bufs_init(&ctx->dpb_bufs);

        ctx->fbc_header_len = MPP_ALIGN(((mb_wd64 * mb_h64) << 6), SZ_8K);
        size[0] = ctx->fbc_header_len + ((mb_wd64 * mb_h64) << 12) * 3 / 2; //fbc_h + fbc_b
        size[1] = (mb_wd64 * mb_h64 << 8);
        size[2] = MPP_ALIGN(mb_wd64 * mb_h64 * 16 * 6, 256);
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_h265e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->frame_size, frame_size, old_max_cnt, new_max_cnt);

        hal_bufs_setup(ctx->dpb_bufs, new_max_cnt, 3, size);

        ctx->frame_size = frame_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
    hal_h265e_leave();
    return ret;
}